

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeAddParseSchemaOp(Vdbe *p,int iDb,char *zWhere,u16 p5)

{
  u16 in_CX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  Vdbe *in_RDI;
  int unaff_retaddr;
  int j;
  int in_stack_ffffffffffffffdc;
  int iVar1;
  undefined2 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
                    (int)in_RDX,CONCAT22(in_CX,in_stack_ffffffffffffffe4),-0x55555556,
                    (char *)CONCAT44(in_stack_ffffffffffffffdc,0xfffffffa),unaff_retaddr);
  sqlite3VdbeChangeP5(in_RDI,in_CX);
  for (iVar1 = 0; iVar1 < in_RDI->db->nDb; iVar1 = iVar1 + 1) {
    sqlite3VdbeUsesBtree
              ((Vdbe *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,iVar1)),
               in_stack_ffffffffffffffdc);
  }
  sqlite3MayAbort(in_RDI->pParse);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeAddParseSchemaOp(Vdbe *p, int iDb, char *zWhere, u16 p5){
  int j;
  sqlite3VdbeAddOp4(p, OP_ParseSchema, iDb, 0, 0, zWhere, P4_DYNAMIC);
  sqlite3VdbeChangeP5(p, p5);
  for(j=0; j<p->db->nDb; j++) sqlite3VdbeUsesBtree(p, j);
  sqlite3MayAbort(p->pParse);
}